

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

void __thiscall
google::protobuf::DescriptorPool::DescriptorPool
          (DescriptorPool *this,DescriptorDatabase *fallback_database,
          ErrorCollector *error_collector)

{
  _Rb_tree_header *p_Var1;
  WrappedMutex *pWVar2;
  Tables *this_00;
  
  pWVar2 = (WrappedMutex *)operator_new(0x28);
  (pWVar2->mu_).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(pWVar2->mu_).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(pWVar2->mu_).super___mutex_base._M_mutex + 0x10) = 0;
  (pWVar2->mu_).super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  (pWVar2->mu_).super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  this->mutex_ = pWVar2;
  this->fallback_database_ = fallback_database;
  this->default_error_collector_ = error_collector;
  this->underlay_ = (DescriptorPool *)0x0;
  this_00 = (Tables *)operator_new(600);
  Tables::Tables(this_00);
  (this->tables_)._M_t.
  super___uniq_ptr_impl<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
  ._M_t.
  super__Tuple_impl<0UL,_google::protobuf::DescriptorPool::Tables_*,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
  .super__Head_base<0UL,_google::protobuf::DescriptorPool::Tables_*,_false>._M_head_impl = this_00;
  this->enforce_dependencies_ = true;
  p_Var1 = &(this->unused_import_track_files_)._M_t._M_impl.super__Rb_tree_header;
  (this->unused_import_track_files_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->unused_import_track_files_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  this->lazily_build_dependencies_ = false;
  this->allow_unknown_ = false;
  this->enforce_weak_ = false;
  this->disallow_enforce_utf8_ = false;
  (this->unused_import_track_files_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->unused_import_track_files_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->unused_import_track_files_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  return;
}

Assistant:

DescriptorPool::DescriptorPool(DescriptorDatabase* fallback_database,
                               ErrorCollector* error_collector)
    : mutex_(new internal::WrappedMutex),
      fallback_database_(fallback_database),
      default_error_collector_(error_collector),
      underlay_(nullptr),
      tables_(new Tables),
      enforce_dependencies_(true),
      lazily_build_dependencies_(false),
      allow_unknown_(false),
      enforce_weak_(false),
      disallow_enforce_utf8_(false) {}